

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,int,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,int right,ValidityMask *mask,idx_t idx
                   )

{
  idx_t iVar1;
  OutOfRangeException *this;
  Bit *this_00;
  bitstring_t bits;
  string_t target;
  anon_union_16_2_67f50693_for_value local_78;
  undefined1 local_68 [24];
  anon_union_16_2_67f50693_for_value local_50;
  string local_40;
  idx_t len;
  
  local_78.pointer.ptr = (char *)local_78._0_8_;
  bits.value._8_8_ = left.value._8_8_;
  this_00 = left.value._0_8_;
  bits.value._0_8_ = bits.value._8_8_;
  local_50._0_8_ = this_00;
  local_50.pointer.ptr = bits.value._8_8_;
  iVar1 = Bit::BitLength(this_00,bits);
  if (right == 0) {
    local_78.pointer.ptr = local_50.pointer.ptr;
    local_78._0_8_ = local_50._0_8_;
  }
  else {
    if (right < 0) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_68;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Cannot left-shift by negative number %s","");
      NumericHelper::ToString<int>(&local_40,right);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string>
                (this,(string *)&local_78.pointer,&local_40);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString
                   ((StringVector *)fun.result,(Vector *)((ulong)this_00 & 0xffffffff),len);
    if (right < (int)iVar1) {
      Bit::LeftShift((bitstring_t *)&local_50.pointer,(ulong)(uint)right,
                     (bitstring_t *)&local_78.pointer);
    }
    else {
      Bit::SetEmptyBitString((bitstring_t *)&local_78.pointer,(string_t *)&local_50.pointer);
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_78.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}